

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgUtils.cpp
# Opt level: O0

bool rsg::isUndefinedValueRange(ConstValueRangeAccess valueRange)

{
  int iVar1;
  bool bVar2;
  Type TVar3;
  int iVar4;
  VariableType *pVVar5;
  TestError *this;
  bool local_8d;
  ConstValueAccess local_68;
  ConstStridedValueAccess<1> local_58;
  Scalar local_48;
  int local_44;
  ConstValueAccess local_40;
  ConstStridedValueAccess<1> local_30;
  Scalar local_1c;
  int local_18;
  Scalar local_14;
  int ndx;
  Scalar infMax;
  Scalar infMin;
  bool isFloat;
  
  pVVar5 = ConstValueRangeAccess::getType((ConstValueRangeAccess *)&stack0x00000008);
  TVar3 = VariableType::getBaseType(pVVar5);
  if (TVar3 - TYPE_FLOAT < 2) {
    pVVar5 = ConstValueRangeAccess::getType((ConstValueRangeAccess *)&stack0x00000008);
    TVar3 = VariableType::getBaseType(pVVar5);
    infMax.intVal._2_1_ = TVar3 == TYPE_FLOAT;
    if ((bool)infMax.intVal._2_1_) {
      ndx = (int)Scalar::min<float>();
    }
    else {
      ndx = (int)Scalar::min<int>();
    }
    if ((infMax.intVal._2_1_ & 1) == 0) {
      local_14 = Scalar::max<int>();
    }
    else {
      local_14 = Scalar::max<float>();
    }
    local_18 = 0;
    while( true ) {
      iVar1 = local_18;
      pVVar5 = ConstValueRangeAccess::getType((ConstValueRangeAccess *)&stack0x00000008);
      iVar4 = VariableType::getNumElements(pVVar5);
      if (iVar4 <= iVar1) break;
      local_40 = ConstValueRangeAccess::getMin((ConstValueRangeAccess *)&stack0x00000008);
      local_30 = ConstStridedValueAccess<1>::component(&local_40,local_18);
      local_1c = ConstStridedValueAccess<1>::asScalar(&local_30);
      local_44 = ndx;
      bVar2 = Scalar::operator!=((Scalar *)&local_1c.boolVal,(Scalar)ndx);
      local_8d = true;
      if (!bVar2) {
        local_68 = ConstValueRangeAccess::getMax((ConstValueRangeAccess *)&stack0x00000008);
        local_58 = ConstStridedValueAccess<1>::component(&local_68,local_18);
        local_48 = ConstStridedValueAccess<1>::asScalar(&local_58);
        local_8d = Scalar::operator!=((Scalar *)&local_48.boolVal,local_14);
      }
      if (local_8d != false) {
        return false;
      }
      local_18 = local_18 + 1;
    }
    infMax.intVal._3_1_ = 1;
  }
  else {
    if (TVar3 != TYPE_BOOL) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Unsupported type",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/randomshaders/rsgUtils.cpp"
                 ,0x95);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    infMax.intVal._3_1_ = 0;
  }
  return infMax._3_1_;
}

Assistant:

bool isUndefinedValueRange (ConstValueRangeAccess valueRange)
{
	switch (valueRange.getType().getBaseType())
	{
		case VariableType::TYPE_FLOAT:
		case VariableType::TYPE_INT:
		{
			bool	isFloat	= valueRange.getType().getBaseType() == VariableType::TYPE_FLOAT;
			Scalar	infMin	= isFloat ? Scalar::min<float>() : Scalar::min<int>();
			Scalar	infMax	= isFloat ? Scalar::max<float>() : Scalar::max<int>();

			for (int ndx = 0; ndx < valueRange.getType().getNumElements(); ndx++)
			{
				if (valueRange.getMin().component(ndx).asScalar() != infMin ||
					valueRange.getMax().component(ndx).asScalar() != infMax)
					return false;
			}
			return true;
		}

		case VariableType::TYPE_BOOL:
			return false;

		default:
			TCU_FAIL("Unsupported type");
	}
}